

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void rollback_to_zero_after_compact_test(bool multi_kv)

{
  void *key;
  char *pcVar1;
  byte in_DIL;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char kv_name [8];
  char bodybuf [64];
  char metabuf [64];
  char keybuf [64];
  fdb_status status;
  fdb_kvs_info info;
  fdb_doc *doc [20];
  fdb_file_handle *dbfile_comp;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db [4];
  int num_kvs;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffffbe8;
  fdb_file_handle *in_stack_fffffffffffffbf0;
  size_t in_stack_fffffffffffffbf8;
  void *in_stack_fffffffffffffc00;
  fdb_doc **in_stack_fffffffffffffc08;
  fdb_doc **doc_00;
  fdb_kvs_handle **in_stack_fffffffffffffc20;
  fdb_seqnum_t in_stack_fffffffffffffd10;
  fdb_kvs_handle **in_stack_fffffffffffffd18;
  fdb_kvs_info *in_stack_fffffffffffffd50;
  fdb_kvs_handle *in_stack_fffffffffffffd58;
  fdb_kvs_config *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  fdb_kvs_handle **in_stack_fffffffffffffda0;
  fdb_file_handle *in_stack_fffffffffffffda8;
  char local_240 [8];
  char local_238 [64];
  fdb_config *in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  fdb_file_handle **in_stack_fffffffffffffe18;
  char local_1b8 [76];
  fdb_status local_16c;
  long local_160;
  long local_158;
  long local_148;
  fdb_file_handle local_138 [4];
  undefined8 local_88 [4];
  int local_68;
  undefined4 local_64;
  uint local_60;
  uint local_5c;
  __time_t local_38;
  __suseconds_t local_30;
  timeval local_18;
  byte local_1;
  
  local_1 = in_DIL & 1;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  local_38 = local_18.tv_sec;
  local_30 = local_18.tv_usec;
  local_64 = 0x14;
  local_68 = 4;
  local_60 = system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fdb_open(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  if ((local_1 & 1) == 0) {
    local_68 = 1;
    fdb_kvs_open_default
              (in_stack_fffffffffffffbf0,&in_stack_fffffffffffffbe8->root,(fdb_kvs_config *)0x11cd05
              );
  }
  else {
    for (local_60 = 0; (int)local_60 < local_68; local_60 = local_60 + 1) {
      sprintf(local_240,"kv%d",(ulong)local_60);
      fdb_kvs_open(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                   in_stack_fffffffffffffd90);
    }
  }
  local_60 = 0;
  do {
    if (local_68 <= (int)local_60) {
      for (local_5c = 0; (int)local_5c < 5; local_5c = local_5c + 1) {
        sprintf(local_1b8,"key%d",(ulong)local_5c);
        sprintf(&stack0xfffffffffffffe08,"meta%d",(ulong)local_5c);
        sprintf(local_238,"body%d",(ulong)local_5c);
        strlen(local_1b8);
        strlen(&stack0xfffffffffffffe08);
        in_stack_fffffffffffffbe8 = (fdb_file_handle *)strlen(local_238);
        fdb_doc_create(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8
                       ,in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8,(void *)0x11cefa
                       ,(size_t)in_stack_fffffffffffffc20);
        for (local_60 = 0; (int)local_60 < local_68; local_60 = local_60 + 1) {
          fdb_set((fdb_kvs_handle *)local_88[(int)local_60],
                  (fdb_doc *)(&local_138[0].root)[(int)local_5c]);
        }
      }
      fdb_commit(in_stack_fffffffffffffbe8,'\0');
      for (; (int)local_5c < 10; local_5c = local_5c + 1) {
        sprintf(local_1b8,"key%d",(ulong)local_5c);
        sprintf(&stack0xfffffffffffffe08,"meta%d",(ulong)local_5c);
        sprintf(local_238,"body%d",(ulong)local_5c);
        strlen(local_1b8);
        strlen(&stack0xfffffffffffffe08);
        in_stack_fffffffffffffbe8 = (fdb_file_handle *)strlen(local_238);
        fdb_doc_create(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8
                       ,in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8,(void *)0x11d089
                       ,(size_t)in_stack_fffffffffffffc20);
        for (local_60 = 0; (int)local_60 < local_68; local_60 = local_60 + 1) {
          fdb_set((fdb_kvs_handle *)local_88[(int)local_60],
                  (fdb_doc *)(&local_138[0].root)[(int)local_5c]);
        }
      }
      fdb_commit(in_stack_fffffffffffffbe8,'\0');
      for (; (int)local_5c < 0xf; local_5c = local_5c + 1) {
        sprintf(local_1b8,"key%d",(ulong)local_5c);
        sprintf(&stack0xfffffffffffffe08,"meta%d",(ulong)local_5c);
        sprintf(local_238,"body%d",(ulong)local_5c);
        in_stack_fffffffffffffc20 = &local_138[0].root + (int)local_5c;
        strlen(local_1b8);
        strlen(&stack0xfffffffffffffe08);
        in_stack_fffffffffffffbe8 = (fdb_file_handle *)strlen(local_238);
        fdb_doc_create(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8
                       ,in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8,(void *)0x11d203
                       ,(size_t)in_stack_fffffffffffffc20);
        for (local_60 = 0; (int)local_60 < local_68; local_60 = local_60 + 1) {
          fdb_set((fdb_kvs_handle *)local_88[(int)local_60],
                  (fdb_doc *)(&local_138[0].root)[(int)local_5c]);
        }
      }
      fdb_commit(in_stack_fffffffffffffbe8,'\0');
      for (; (int)local_5c < 0x14; local_5c = local_5c + 1) {
        sprintf(local_1b8,"key%d",(ulong)local_5c);
        sprintf(&stack0xfffffffffffffe08,"meta%d",(ulong)local_5c);
        sprintf(local_238,"body%d",(ulong)local_5c);
        in_stack_fffffffffffffbf0 = (fdb_file_handle *)(&local_138[0].root + (int)local_5c);
        pcVar1 = local_1b8;
        key = (void *)strlen(local_1b8);
        doc_00 = (fdb_doc **)&stack0xfffffffffffffe08;
        strlen(&stack0xfffffffffffffe08);
        in_stack_fffffffffffffbe8 = (fdb_file_handle *)strlen(local_238);
        fdb_doc_create(doc_00,key,(size_t)pcVar1,in_stack_fffffffffffffbf0,
                       (size_t)in_stack_fffffffffffffbe8,(void *)0x11d380,
                       (size_t)in_stack_fffffffffffffc20);
        for (local_60 = 0; (int)local_60 < local_68; local_60 = local_60 + 1) {
          fdb_set((fdb_kvs_handle *)local_88[(int)local_60],
                  (fdb_doc *)(&local_138[0].root)[(int)local_5c]);
        }
      }
      fdb_commit(in_stack_fffffffffffffbe8,'\0');
      local_16c = fdb_open(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                           in_stack_fffffffffffffe08);
      if (local_16c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1104);
        rollback_to_zero_after_compact_test::__test_pass = 0;
        if (local_16c != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1104,"void rollback_to_zero_after_compact_test(bool)");
        }
      }
      local_16c = fdb_compact(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
      if (local_16c != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1107);
        rollback_to_zero_after_compact_test::__test_pass = 0;
        if (local_16c != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1107,"void rollback_to_zero_after_compact_test(bool)");
        }
      }
      fdb_close(in_stack_fffffffffffffbe8);
      local_60 = 0;
      do {
        if (local_68 <= (int)local_60) {
          local_16c = fdb_commit(in_stack_fffffffffffffbe8,'\0');
          if (local_16c != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x111c);
            rollback_to_zero_after_compact_test::__test_pass = 0;
            if (local_16c != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x111c,"void rollback_to_zero_after_compact_test(bool)");
            }
          }
          fdb_close(in_stack_fffffffffffffbe8);
          for (local_5c = 0; (int)local_5c < 0x14; local_5c = local_5c + 1) {
            fdb_doc_free((fdb_doc *)0x11d957);
          }
          fdb_shutdown();
          pcVar1 = "single kv mode:";
          if ((local_1 & 1) != 0) {
            pcVar1 = "multiple kv mode:";
          }
          sprintf(local_238,"rollback to zero after compact test %s",pcVar1);
          if (rollback_to_zero_after_compact_test::__test_pass == 0) {
            fprintf(_stderr,"%s FAILED\n",local_238);
          }
          else {
            fprintf(_stderr,"%s PASSED\n",local_238);
          }
          return;
        }
        local_16c = fdb_rollback(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
        if (local_16c != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x110d);
          rollback_to_zero_after_compact_test::__test_pass = 0;
          if (local_16c != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x110d,"void rollback_to_zero_after_compact_test(bool)");
          }
        }
        local_16c = fdb_get_kvs_info(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
        if (local_16c != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x110f);
          rollback_to_zero_after_compact_test::__test_pass = 0;
          if (local_16c != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x110f,"void rollback_to_zero_after_compact_test(bool)");
          }
        }
        if (local_160 != 0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1110);
          rollback_to_zero_after_compact_test::__test_pass = 0;
          if (local_160 != 0) {
            __assert_fail("info.last_seqnum == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x1110,"void rollback_to_zero_after_compact_test(bool)");
          }
        }
        if (local_158 != 0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1111);
          rollback_to_zero_after_compact_test::__test_pass = 0;
          if (local_158 != 0) {
            __assert_fail("info.doc_count == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x1111,"void rollback_to_zero_after_compact_test(bool)");
          }
        }
        if (local_148 != 0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1112);
          rollback_to_zero_after_compact_test::__test_pass = 0;
          if (local_148 != 0) {
            __assert_fail("info.space_used == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x1112,"void rollback_to_zero_after_compact_test(bool)");
          }
        }
        local_16c = fdb_get((fdb_kvs_handle *)local_88[(int)local_60],(fdb_doc *)local_138[0].root);
        if (local_16c != FDB_RESULT_KEY_NOT_FOUND) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1114);
          rollback_to_zero_after_compact_test::__test_pass = 0;
          if (local_16c != FDB_RESULT_KEY_NOT_FOUND) {
            __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x1114,"void rollback_to_zero_after_compact_test(bool)");
          }
        }
        local_16c = fdb_set((fdb_kvs_handle *)local_88[(int)local_60],(fdb_doc *)local_138[0].root);
        if (local_16c != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1117);
          rollback_to_zero_after_compact_test::__test_pass = 0;
          if (local_16c != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x1117,"void rollback_to_zero_after_compact_test(bool)");
          }
        }
        local_60 = local_60 + 1;
      } while( true );
    }
    local_16c = fdb_set_log_callback
                          ((fdb_kvs_handle *)local_88[(int)local_60],logCallbackFunc,
                           "rollback_to_zero_after_compact_test");
    if (local_16c != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x10c4);
      rollback_to_zero_after_compact_test::__test_pass = 0;
      if (local_16c != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x10c4,"void rollback_to_zero_after_compact_test(bool)");
      }
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

void rollback_to_zero_after_compact_test(bool multi_kv)
{
    TEST_INIT();

    int i, r;
    const int n = 20;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_kvs_handle *db[4]; // same as num_kvs
    fdb_file_handle *dbfile, *dbfile_comp;
    fdb_doc *doc[n];
    fdb_kvs_info info;
    fdb_status status;

    char keybuf[64], metabuf[64], bodybuf[64];
    char kv_name[8];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);

    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                         (void *) "rollback_to_zero_after_compact_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

   // ------- Setup test ----------------------------------
   // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 9
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit again without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // open db
    status = fdb_open(&dbfile_comp, "./mvcc_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_compact(dbfile_comp, "./mvcc_test2");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile_comp);

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_rollback(&db[r], 0);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_get_kvs_info(db[r], &info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(info.last_seqnum == 0);
        TEST_CHK(info.doc_count == 0);
        TEST_CHK(info.space_used == 0);
        status = fdb_get(db[r], doc[0]);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        // test normal operation after rollback
        status = fdb_set(db[r], doc[0]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // test normal operation after rollbacks manually flush WAL & commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    sprintf(bodybuf, "rollback to zero after compact test %s",
            multi_kv ? "multiple kv mode:" : "single kv mode:");
    TEST_RESULT(bodybuf);
}